

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conversion.h
# Opt level: O0

Conversion * __thiscall
Conversion::convert_to_voacb_base_abi_cxx11_(Conversion *this,BigInt *num_decimal_base)

{
  undefined1 uVar1;
  undefined1 uVar2;
  bool bVar3;
  char *pcVar4;
  ulong uVar5;
  undefined1 *puVar6;
  BigInt *in_RDX;
  int local_1e4;
  int i;
  char temp;
  BigInt local_1d0;
  longlong local_1b0;
  longlong base;
  stringstream ss;
  ostream local_198 [384];
  BigInt *num_decimal_base_local;
  Conversion *this_local;
  string *result;
  
  num_decimal_base_local = num_decimal_base;
  this_local = this;
  std::__cxx11::stringstream::stringstream((stringstream *)&base);
  local_1b0 = std::__cxx11::string::size();
  while( true ) {
    BigInt::BigInt(&local_1d0,0);
    bVar3 = BigInt::operator>(in_RDX,&local_1d0);
    BigInt::~BigInt(&local_1d0);
    if (!bVar3) break;
    BigInt::operator%(in_RDX,local_1b0);
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)num_decimal_base);
    std::operator<<(local_198,*pcVar4);
    BigInt::operator/=(in_RDX,&local_1b0);
  }
  std::__cxx11::stringstream::str();
  for (local_1e4 = 0; uVar5 = std::__cxx11::string::size(), (ulong)(long)local_1e4 < uVar5 >> 1;
      local_1e4 = local_1e4 + 1) {
    puVar6 = (undefined1 *)std::__cxx11::string::operator[]((ulong)this);
    uVar1 = *puVar6;
    std::__cxx11::string::size();
    puVar6 = (undefined1 *)std::__cxx11::string::operator[]((ulong)this);
    uVar2 = *puVar6;
    puVar6 = (undefined1 *)std::__cxx11::string::operator[]((ulong)this);
    *puVar6 = uVar2;
    std::__cxx11::string::size();
    puVar6 = (undefined1 *)std::__cxx11::string::operator[]((ulong)this);
    *puVar6 = uVar1;
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&base);
  return this;
}

Assistant:

string Conversion::convert_to_voacb_base(BigInt num_decimal_base) {
    stringstream ss;
    long long base = indexToChar.size();
    //! div and mod by base
  /*  while (num_decimal_base > BigInt(0)) {
        ss << indexToChar[num_decimal_base % base];
        num_decimal_base /= base;
    }*/

    for (; num_decimal_base > BigInt(0); num_decimal_base /= base)
        ss << indexToChar[num_decimal_base % base]; //! pushing least significant first which is obtained by mod

    string result = ss.str();
    char temp;
    //! reverse
    for (int i = 0; i < result.size() / 2; i++) {
        temp = result[i];
        result[i] = result[result.size() - 1 - i];
        result[result.size() - 1 - i] = temp;
    }
    return result;
}